

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O2

void ssh2_mkkey(ssh2_transport_state *s,strbuf *out,strbuf *kex_shared_secret,uchar *H,char chr,
               int keylen)

{
  int iVar1;
  ptrlen pl;
  ptrlen pl_00;
  uchar *data;
  ssh_hash *psVar2;
  ssh_hash *h;
  size_t len;
  long lVar3;
  int iVar4;
  uchar *out_00;
  long lVar5;
  
  if (keylen != 0) {
    iVar1 = (int)s->kex_alg->hash->hlen;
    iVar4 = keylen + iVar1 + -1;
    iVar4 = iVar4 - iVar4 % iVar1;
    strbuf_clear(out);
    data = (uchar *)strbuf_append(out,(long)iVar4);
    psVar2 = ssh_hash_new(s->kex_alg->hash);
    if (((s->ppl).remote_bugs & 0x20) == 0) {
      pl.ptr = kex_shared_secret->u;
      pl.len = kex_shared_secret->len;
      BinarySink_put_datapl(psVar2->binarysink_,pl);
    }
    len = (size_t)iVar1;
    BinarySink_put_data(psVar2->binarysink_,H,len);
    BinarySink_put_byte(psVar2->binarysink_,chr);
    BinarySink_put_data(psVar2->binarysink_,s->session_id,(long)s->session_id_len);
    (*psVar2->vt->digest)(psVar2,data);
    if (iVar1 < iVar4) {
      (*psVar2->vt->reset)(psVar2);
      if (((s->ppl).remote_bugs & 0x20) == 0) {
        pl_00.ptr = kex_shared_secret->u;
        pl_00.len = kex_shared_secret->len;
        BinarySink_put_datapl(psVar2->binarysink_,pl_00);
      }
      BinarySink_put_data(psVar2->binarysink_,H,len);
      lVar5 = (long)iVar1;
      out_00 = data;
      for (lVar3 = lVar5; out_00 = out_00 + lVar5, lVar3 < iVar4; lVar3 = lVar3 + lVar5) {
        BinarySink_put_data(psVar2->binarysink_,data,len);
        h = (*psVar2->vt->new)(psVar2->vt);
        (*h->vt->copyfrom)(h,psVar2);
        ssh_hash_final(h,out_00);
        data = data + lVar5;
      }
    }
    (*psVar2->vt->free)(psVar2);
    return;
  }
  return;
}

Assistant:

static void ssh2_mkkey(
    struct ssh2_transport_state *s, strbuf *out,
    strbuf *kex_shared_secret, unsigned char *H, char chr, int keylen)
{
    int hlen = s->kex_alg->hash->hlen;
    int keylen_padded;
    unsigned char *key;
    ssh_hash *h;

    if (keylen == 0)
        return;

    /*
     * Round the requested amount of key material up to a multiple of
     * the length of the hash we're using to make it. This makes life
     * simpler because then we can just write each hash output block
     * straight into the output buffer without fiddling about
     * truncating the last one. Since it's going into a strbuf, and
     * strbufs are always smemclr()ed on free, there's no need to
     * worry about leaving extra potentially-sensitive data in memory
     * that the caller didn't ask for.
     */
    keylen_padded = ((keylen + hlen - 1) / hlen) * hlen;

    strbuf_clear(out);
    key = strbuf_append(out, keylen_padded);

    /* First hlen bytes. */
    h = ssh_hash_new(s->kex_alg->hash);
    if (!(s->ppl.remote_bugs & BUG_SSH2_DERIVEKEY))
        put_datapl(h, ptrlen_from_strbuf(kex_shared_secret));
    put_data(h, H, hlen);
    put_byte(h, chr);
    put_data(h, s->session_id, s->session_id_len);
    ssh_hash_digest(h, key);

    /* Subsequent blocks of hlen bytes. */
    if (keylen_padded > hlen) {
        int offset;

        ssh_hash_reset(h);
        if (!(s->ppl.remote_bugs & BUG_SSH2_DERIVEKEY))
            put_datapl(h, ptrlen_from_strbuf(kex_shared_secret));
        put_data(h, H, hlen);

        for (offset = hlen; offset < keylen_padded; offset += hlen) {
            put_data(h, key + offset - hlen, hlen);
            ssh_hash_digest_nondestructive(h, key + offset);
        }

    }

    ssh_hash_free(h);
}